

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall
ON_V5_MeshDoubleVertices::DeleteAfterRead
          (ON_V5_MeshDoubleVertices *this,ON_BinaryArchive *archive,ON_Object *parent_object)

{
  bool bVar1;
  ON_Mesh *this_00;
  ON_BoundingBox OStack_48;
  
  this_00 = ON_Mesh::Cast(parent_object);
  if (((this_00 != (ON_Mesh *)0x0) &&
      ((this_00->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count == 0)) &&
     ((this_00->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count ==
      (this->m_V5_dV).super_ON_SimpleArray<ON_3dPoint>.m_count)) {
    ON_3dPointArray::operator=(&this_00->m_dV,&this->m_V5_dV);
    bVar1 = ON_Mesh::HasSynchronizedDoubleAndSinglePrecisionVertices(this_00);
    if (bVar1) {
      ON_Mesh::InvalidateVertexBoundingBox(this_00);
      ON_Geometry::BoundingBox(&OStack_48,&this_00->super_ON_Geometry);
    }
    else {
      ON_SimpleArray<ON_3dPoint>::Destroy(&(this_00->m_dV).super_ON_SimpleArray<ON_3dPoint>);
    }
  }
  return true;
}

Assistant:

bool ON_V5_MeshDoubleVertices::DeleteAfterRead(
  const class ON_BinaryArchive& archive,
  class ON_Object* parent_object
  ) const
{
  ON_Mesh* mesh = ON_Mesh::Cast(parent_object);
  if (nullptr != mesh && 0 == mesh->m_dV.UnsignedCount() )
  {
    const unsigned int vertex_count = mesh->VertexUnsignedCount();
    if (vertex_count == m_V5_dV.UnsignedCount())
    {
      mesh->m_dV = m_V5_dV;
      if (false == mesh->HasSynchronizedDoubleAndSinglePrecisionVertices())
        mesh->DestroyDoublePrecisionVertices();
      else
      {
        // update vertex bounding boxes
        mesh->InvalidateVertexBoundingBox();
        mesh->BoundingBox();
      }
    }
  }
  return true;
}